

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

char * tok_casefold_defsym(tokcxdef *ctx,char *outbuf,char *src,int len)

{
  int iVar1;
  ushort **ppuVar2;
  int in_ECX;
  byte *in_RDX;
  byte *in_RSI;
  long in_RDI;
  int rem;
  char *dst;
  byte local_3c;
  int local_38;
  int local_34;
  byte *local_30;
  byte *local_20;
  byte *local_8;
  
  local_8 = in_RDX;
  if ((*(uint *)(in_RDI + 0x11c) & 2) != 0) {
    local_38 = in_ECX;
    if (0x27 < in_ECX) {
      local_38 = 0x27;
    }
    local_30 = in_RSI;
    local_20 = in_RDX;
    for (local_34 = local_38; local_8 = in_RSI, 0 < local_34; local_34 = local_34 + -1) {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)(uint)*local_20] & 0x100) == 0) {
        local_3c = *local_20;
      }
      else {
        iVar1 = tolower((uint)*local_20);
        local_3c = (byte)iVar1;
      }
      *local_30 = local_3c;
      local_30 = local_30 + 1;
      local_20 = local_20 + 1;
    }
  }
  return (char *)local_8;
}

Assistant:

static char *tok_casefold_defsym(tokcxdef *ctx, char *outbuf,
                                 char *src, int len)
{
    if (ctx->tokcxflg & TOKCXCASEFOLD)
    {
        char *dst;
        int   rem;

        /* make a lower-case copy of the symbol */
        rem = (len > TOKNAMMAX ? TOKNAMMAX : len);
        for (dst = outbuf ; rem > 0 ; ++dst, ++src, --rem)
            *dst = (isupper((uchar)*src) ? tolower((uchar)*src) : *src);

        /* use the lower-case copy instead of the original */
        return outbuf;
    }
    else
    {
        /* return the original unchanged */
        return src;
    }
}